

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_iterator.hpp
# Opt level: O2

void __thiscall
boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
split_iterator<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          Begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                End,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *Finder)

{
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> local_40;
  
  detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
            (&local_40,Finder);
  detail::find_iterator_base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
  find_iterator_base<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
            ((find_iterator_base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>> *)this,
             &local_40,0);
  detail::is_any_ofF<char>::~is_any_ofF(&local_40.m_Pred);
  *(char **)(this + 0x20) = Begin._M_current;
  *(char **)(this + 0x28) = Begin._M_current;
  *(char **)(this + 0x30) = Begin._M_current;
  *(char **)(this + 0x38) = End._M_current;
  this[0x40] = (split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>)0x0;
  if (Begin._M_current != End._M_current) {
    split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increment((split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
  }
  return;
}

Assistant:

split_iterator(
                    IteratorT Begin,
                    IteratorT End,
                    FinderT Finder ) :
                detail::find_iterator_base<IteratorT>(Finder,0),
                m_Match(Begin,Begin),
                m_Next(Begin),
                m_End(End),
                m_bEof(false)
            {
                // force the correct behavior for empty sequences and yield at least one token
                if(Begin!=End)
                {
                    increment();
                }
            }